

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

Uint __thiscall indigox::Molecule::AssignElectrons(Molecule *this)

{
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ElectronOpt *this_00;
  Molecule *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Uint UVar3;
  iterator iVar4;
  size_t sVar5;
  ostream *poVar6;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  Atom_p atm;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2> *local_90;
  Molecule *local_88;
  undefined1 local_80 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  
  UVar3 = MolecularGraph::NumConnectedComponents
                    ((this->graph_).
                     super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  if (UVar3 == 1) {
    local_90 = &(this->graph_).
                super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>;
    p_Var1 = &((this->atoms_).
               super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>;
    local_88 = this;
    for (p_Var7 = &((this->atoms_).
                    super__Vector_base<std::shared_ptr<indigox::Atom>,_std::allocator<std::shared_ptr<indigox::Atom>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>; this_01 = local_88
        , p_Var7 != p_Var1; p_Var7 = p_Var7 + 1) {
      std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_a0,p_Var7);
      Atom::GetElement((Atom *)&stack0xffffffffffffffb0);
      _Var2._M_pi = local_50._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
      if (_Var2._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Not all atoms have elements assigned.");
        std::endl<char,std::char_traits<char>>(poVar6);
LAB_0010b2c4:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
        return 0;
      }
      Atom::GetElement((Atom *)(local_80 + 0x10));
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffb0,(string *)(local_80._16_8_ + 0x20));
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&Options::AssignElectrons::ALLOWED_ELEMENTS_abi_cxx11_._M_t,
                     (key_type *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
      if ((_Rb_tree_header *)iVar4._M_node ==
          &Options::AssignElectrons::ALLOWED_ELEMENTS_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
      {
        Atom::GetElement((Atom *)local_80);
        poVar6 = operator<<((ostream *)&std::cerr,(Element_p *)local_80);
        poVar6 = std::operator<<(poVar6," is not an allowed element for the algorithm.");
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
        goto LAB_0010b2c4;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    }
    this_00 = (local_88->elnopt_)._M_t.
              super___uniq_ptr_impl<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>
              ._M_t.
              super__Tuple_impl<0UL,_indigox::ElectronOpt_*,_std::default_delete<indigox::ElectronOpt>_>
              .super__Head_base<0UL,_indigox::ElectronOpt_*,_false>._M_head_impl;
    std::__shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,local_90);
    ElectronOpt::SetMolecularGraph(this_00,(shared_ptr<indigox::MolecularGraph> *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    this_01->modified_ = false;
    sVar5 = ElectronOpt::Run((this_01->elnopt_)._M_t.
                             super___uniq_ptr_impl<indigox::ElectronOpt,_std::default_delete<indigox::ElectronOpt>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_indigox::ElectronOpt_*,_std::default_delete<indigox::ElectronOpt>_>
                             .super__Head_base<0UL,_indigox::ElectronOpt_*,_false>._M_head_impl);
    if ((Uint)sVar5 != 0) {
      ApplyElectronAssignment(this_01,0);
      return (Uint)sVar5;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Electrons can only be assigned when molecule has only one component.")
    ;
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  return 0;
}

Assistant:

Uint Molecule::AssignElectrons() {
  // check is single component (use graph)
  /// @todo
  if (graph_->NumConnectedComponents() != 1) {
    std::cerr << "Electrons can only be assigned when molecule has only one component." << std::endl;
    return 0;
  }
  
  // check all elements valid.
  typedef Options::AssignElectrons opt_;
  for (Atom_p atm : atoms_) {
    if (!atm->GetElement()) {
      std::cerr << "Not all atoms have elements assigned." << std::endl;
      return 0;
    }
    if (opt_::ALLOWED_ELEMENTS.find(atm->GetElement()->GetSymbol())
        == opt_::ALLOWED_ELEMENTS.end()) {
      std::cerr << atm->GetElement() << " is not an allowed element for the algorithm." << std::endl;
      return 0;
    }
  }
  
  // Set the ElectronOpt graph
  elnopt_->SetMolecularGraph(graph_);
  modified_ = false;
  Uint num = (Uint)elnopt_->Run();
  if (num) ApplyElectronAssignment(0);
//  for (auto& tmp : idx_to_atom_) {
//    Atom_p atom = tmp.second.lock();
//    if (atom->GetFormalCharge() != 0) {
//      std::cout << tmp.first << " : " << atom->GetFormalCharge() << std::endl;
//    }
//  }
//  
//  for (auto& tmp : idx_to_bond_) {
//    Bond_p bond = tmp.second.lock();
//    if (bond->GetOrder() != BondOrder::SINGLE_BOND) {
//      uid_t a = bond->GetSourceAtom()->GetIndex();
//      uid_t b = bond->GetTargetAtom()->GetIndex();
//      if (a <= b) std::cout << a << "-" << b << " : " << bond->GetOrder() << std::endl;
//      else std::cout << b << "-" << a << " : " << bond->GetOrder() << std::endl;
//    }
//  }
  return num;
}